

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  int iVar1;
  long lVar2;
  HandlerBase *pHVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  Entry *pEVar8;
  Type *in_R8;
  uint uVar9;
  ulong uVar10;
  Maybe<unsigned_long> MVar11;
  
  pEVar8 = table.ptr;
  lVar2._0_2_ = pEVar8[1].key.baseType;
  lVar2._2_1_ = pEVar8[1].key.listDepth;
  lVar2._3_1_ = pEVar8[1].key.isImplicitParam;
  lVar2._4_2_ = pEVar8[1].key.field_3;
  lVar2._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
  aVar7.value = table.size_;
  if (lVar2 != 0) {
    uVar5 = capnp::Type::hashCode(in_R8);
    lVar6._0_2_ = pEVar8[1].key.baseType;
    lVar6._2_1_ = pEVar8[1].key.listDepth;
    lVar6._3_1_ = pEVar8[1].key.isImplicitParam;
    lVar6._4_2_ = pEVar8[1].key.field_3;
    lVar6._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
    uVar9 = (int)lVar6 - 1U & uVar5;
    aVar7 = extraout_RDX;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pHVar3 = pEVar8->value;
      iVar1 = *(int *)((long)&pHVar3[uVar10]._vptr_HandlerBase + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)&pHVar3[uVar10]._vptr_HandlerBase == uVar5)) {
        bVar4 = capnp::Type::operator==((Type *)((ulong)(iVar1 - 2) * 0x18 + table.size_),in_R8);
        aVar7 = extraout_RDX_00;
        if (bVar4) {
          iVar1 = *(int *)((long)&pHVar3[uVar10]._vptr_HandlerBase + 4);
          *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1
          ;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_0028dc7e;
        }
        lVar6._0_2_ = pEVar8[1].key.baseType;
        lVar6._2_1_ = pEVar8[1].key.listDepth;
        lVar6._3_1_ = pEVar8[1].key.isImplicitParam;
        lVar6._4_2_ = pEVar8[1].key.field_3;
        lVar6._6_2_ = *(undefined2 *)&pEVar8[1].key.field_0x6;
      }
      uVar9 = (uint)(uVar10 + 1);
      if (uVar10 + 1 == lVar6) {
        uVar9 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
LAB_0028dc7e:
  MVar11.ptr.field_1.value = aVar7.value;
  MVar11.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar11.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }